

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O0

size_t __thiscall adios2::format::BP4Serializer::CloseData(BP4Serializer *this,IO *io)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  long *in_RDI;
  BP4Serializer *unaff_retaddr;
  string *in_stack_00000038;
  IOChrono *in_stack_00000040;
  size_t dataEndsAt;
  key_type *in_stack_ffffffffffffff18;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff20;
  allocator *paVar3;
  string *process;
  IOChrono *in_stack_ffffffffffffff60;
  string local_98 [39];
  allocator local_71;
  string local_70 [32];
  size_t local_50;
  allocator<char> local_31;
  string local_30 [8];
  IO *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  long *plVar4;
  undefined2 uVar5;
  
  process = (string *)&local_31;
  plVar4 = in_RDI;
  std::allocator<char>::allocator();
  uVar5 = (undefined2)((ulong)plVar4 >> 0x30);
  std::__cxx11::string::string(local_30,"buffering",(allocator *)process);
  profiling::IOChrono::Start(in_stack_00000040,in_stack_00000038);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  local_50 = *(size_t *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x60);
  if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x270) & 1) == 0) {
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0) & 1) != 0) {
      SerializeDataBuffer((BP4Serializer *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    local_50 = *(size_t *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x60);
    SerializeMetadataInData(unaff_retaddr,SUB21((ushort)uVar5 >> 8,0),SUB21(uVar5,0));
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x2e8) & 1) != 0) {
      mVar1 = *(mapped_type *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"buffering",&local_71);
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::at(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      *pmVar2 = mVar1;
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    aggregator::MPIChain::Close((MPIChain *)0xc25e79);
    *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x270) = 1;
  }
  paVar3 = (allocator *)&stack0xffffffffffffff67;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"buffering",paVar3);
  profiling::IOChrono::Stop(in_stack_ffffffffffffff60,process);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  return local_50;
}

Assistant:

size_t BP4Serializer::CloseData(core::IO &io)
{
    m_Profiler.Start("buffering");
    size_t dataEndsAt = m_Data.m_Position;
    if (!m_IsClosed)
    {
        if (m_MetadataSet.DataPGIsOpen)
        {
            SerializeDataBuffer(io);
        }
        dataEndsAt = m_Data.m_Position;

        SerializeMetadataInData(false, false);

        if (m_Profiler.m_IsActive)
        {
            m_Profiler.m_Bytes.at("buffering") = m_Data.m_AbsolutePosition;
        }

        m_Aggregator.Close();
        m_IsClosed = true;
    }

    m_Profiler.Stop("buffering");
    return dataEndsAt;
}